

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_test.cc
# Opt level: O0

void __thiscall typed_argument_equality::test_method(typed_argument_equality *this)

{
  undefined8 uVar1;
  bool bVar2;
  typed_option<int> *ptVar3;
  base_option *b3;
  base_option *b2;
  base_option *b1;
  typed_option<float> local_res370;
  typed_option<int> arg2;
  typed_option<int> arg1;
  float float_loc;
  int int_loc_other;
  int int_loc;
  typed_option<float> *in_stack_fffffffffffff858;
  typed_option<float> *in_stack_fffffffffffff860;
  undefined4 in_stack_fffffffffffff868;
  float in_stack_fffffffffffff86c;
  typed_option<float> *in_stack_fffffffffffff870;
  basic_cstring<const_char> local_6a8;
  basic_cstring<const_char> local_698;
  undefined1 local_688 [32];
  undefined1 local_668 [24];
  undefined1 local_650 [16];
  basic_cstring<const_char> local_640;
  basic_cstring<const_char> local_630;
  basic_cstring<const_char> local_620;
  undefined1 local_610 [32];
  undefined1 local_5f0 [24];
  undefined1 local_5d8 [16];
  basic_cstring<const_char> local_5c8;
  basic_cstring<const_char> local_5b8;
  basic_cstring<const_char> local_5a8;
  undefined1 local_598 [32];
  undefined1 local_578 [24];
  undefined1 local_560 [16];
  basic_cstring<const_char> local_550;
  undefined1 *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  allocator local_521;
  string local_520 [39];
  allocator local_4f9;
  string local_4f8 [192];
  undefined1 local_438 [167];
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [39];
  allocator local_341;
  string local_340 [192];
  undefined1 local_280 [167];
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [55];
  allocator local_179;
  string local_178 [192];
  undefined1 local_b8 [184];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"int_opt",&local_179);
  VW::config::make_option<int>
            ((string *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
             (int *)in_stack_fffffffffffff860);
  VW::config::typed_option<int>::default_value
            ((typed_option<int> *)in_stack_fffffffffffff870,(int)in_stack_fffffffffffff86c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"Help text",&local_1b1);
  ptVar3 = VW::config::typed_option<int>::help
                     ((typed_option<int> *)in_stack_fffffffffffff860,
                      (string *)in_stack_fffffffffffff858);
  VW::config::typed_option<int>::keep(ptVar3,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"t",&local_1d9);
  VW::config::typed_option<int>::short_name
            ((typed_option<int> *)in_stack_fffffffffffff860,(string *)in_stack_fffffffffffff858);
  VW::config::typed_option<int>::typed_option
            ((typed_option<int> *)in_stack_fffffffffffff860,
             (typed_option<int> *)in_stack_fffffffffffff858);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_fffffffffffff860);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"int_opt",&local_341);
  VW::config::make_option<int>
            ((string *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
             (int *)in_stack_fffffffffffff860);
  VW::config::typed_option<int>::default_value
            ((typed_option<int> *)in_stack_fffffffffffff870,(int)in_stack_fffffffffffff86c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_368,"Help text",&local_369);
  ptVar3 = VW::config::typed_option<int>::help
                     ((typed_option<int> *)in_stack_fffffffffffff860,
                      (string *)in_stack_fffffffffffff858);
  VW::config::typed_option<int>::keep(ptVar3,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"t",&local_391);
  VW::config::typed_option<int>::short_name
            ((typed_option<int> *)in_stack_fffffffffffff860,(string *)in_stack_fffffffffffff858);
  VW::config::typed_option<int>::typed_option
            ((typed_option<int> *)in_stack_fffffffffffff860,
             (typed_option<int> *)in_stack_fffffffffffff858);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_fffffffffffff860);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f8,"float_opt",&local_4f9);
  VW::config::make_option<float>
            ((string *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
             (float *)in_stack_fffffffffffff860);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff870,in_stack_fffffffffffff86c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_520,"f",&local_521);
  VW::config::typed_option<float>::short_name
            (in_stack_fffffffffffff860,(string *)in_stack_fffffffffffff858);
  VW::config::typed_option<float>::typed_option(in_stack_fffffffffffff860,in_stack_fffffffffffff858)
  ;
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  VW::config::typed_option<float>::~typed_option(in_stack_fffffffffffff860);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  local_530 = local_b8;
  local_538 = local_280;
  local_540 = local_438;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_550,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_test.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff860);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_550,0x39,local_560);
    VW::config::operator==
              ((typed_option<int> *)in_stack_fffffffffffff860,
               (typed_option<int> *)in_stack_fffffffffffff858);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff860,
               SUB81((ulong)in_stack_fffffffffffff858 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5a8,"arg1 == arg2",0xc);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
               (basic_cstring<const_char> *)in_stack_fffffffffffff860);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_test.cc"
               ,0x6d);
    in_stack_fffffffffffff858 = (typed_option<float> *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_578,local_598,&local_5b8,0x39,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x11eefe);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x11ef0b);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_test.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff860);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5c8,0x3a,local_5d8);
    VW::config::operator==
              (&in_stack_fffffffffffff860->super_base_option,
               &in_stack_fffffffffffff858->super_base_option);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff860,
               SUB81((ulong)in_stack_fffffffffffff858 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_620,"*b1 == *b2",10);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
               (basic_cstring<const_char> *)in_stack_fffffffffffff860);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_630,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_test.cc"
               ,0x6d);
    in_stack_fffffffffffff858 = (typed_option<float> *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_5f0,local_610,&local_630,0x3a,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x11f056);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x11f063);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_640,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_test.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff860);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_640,0x3b,local_650);
    VW::config::operator!=
              (&in_stack_fffffffffffff860->super_base_option,
               &in_stack_fffffffffffff858->super_base_option);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff860,
               SUB81((ulong)in_stack_fffffffffffff858 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_698,"*b1 != *b3",10);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
               (basic_cstring<const_char> *)in_stack_fffffffffffff860);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_test.cc"
               ,0x6d);
    in_stack_fffffffffffff858 = (typed_option<float> *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_668,local_688,&local_6a8,0x3b,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x11f1ae);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x11f1bb);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_fffffffffffff86c = (float)CONCAT13(bVar2,SUB43(in_stack_fffffffffffff86c,0));
  } while (bVar2);
  VW::config::typed_option<float>::~typed_option(in_stack_fffffffffffff860);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_fffffffffffff860);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_fffffffffffff860);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(typed_argument_equality) {
  int int_loc;
  int int_loc_other;
  float float_loc;
  auto arg1 = make_option("int_opt", int_loc)
    .default_value(4)
    .help("Help text")
    .keep()
    .short_name("t");

  auto arg2 = make_option("int_opt", int_loc_other)
    .default_value(4)
    .help("Help text")
    .keep()
    .short_name("t");

  auto param_3 = make_option("float_opt", float_loc)
    .default_value(3.2f)
    .short_name("f");

  base_option* b1 = &arg1;
  base_option* b2 = &arg2;
  base_option* b3 = &param_3;

  BOOST_CHECK(arg1 == arg2);
  BOOST_CHECK(*b1 == *b2);
  BOOST_CHECK(*b1 != *b3);
}